

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

string * google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
                   (FieldDescriptor *field,ClassNameResolver *name_resolver,bool boxed)

{
  JavaType JVar1;
  char *pcVar2;
  byte in_CL;
  string *in_RDI;
  Descriptor *in_stack_ffffffffffffffa0;
  allocator *paVar3;
  ClassNameResolver *in_stack_ffffffffffffffa8;
  allocator local_1a;
  byte local_19;
  string *field_00;
  
  local_19 = in_CL & 1;
  field_00 = in_RDI;
  JVar1 = GetJavaType((FieldDescriptor *)in_RDI);
  if (JVar1 == JAVATYPE_MESSAGE) {
    FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffffa0);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  else {
    JVar1 = GetJavaType((FieldDescriptor *)field_00);
    if (JVar1 == JAVATYPE_ENUM) {
      FieldDescriptor::enum_type((FieldDescriptor *)in_stack_ffffffffffffffa0);
      ClassNameResolver::GetImmutableClassName<google::protobuf::EnumDescriptor>
                (in_stack_ffffffffffffffa8,(EnumDescriptor *)in_stack_ffffffffffffffa0);
    }
    else {
      if ((local_19 & 1) == 0) {
        GetJavaType((FieldDescriptor *)field_00);
        pcVar2 = PrimitiveTypeName((JavaType)((ulong)field_00 >> 0x20));
      }
      else {
        GetJavaType((FieldDescriptor *)field_00);
        pcVar2 = BoxedPrimitiveTypeName((JavaType)((ulong)field_00 >> 0x20));
      }
      paVar3 = &local_1a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar2,paVar3);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a);
    }
  }
  return in_RDI;
}

Assistant:

std::string TypeName(const FieldDescriptor* field,
                     ClassNameResolver* name_resolver, bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                 : PrimitiveTypeName(GetJavaType(field));
  }
}